

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O0

void __thiscall
DTextEnterMenu::DTextEnterMenu
          (DTextEnterMenu *this,DMenu *parent,char *textbuffer,int maxlen,int sizemode,bool showgrid
          ,bool allowcolors)

{
  size_t sVar1;
  bool local_3d;
  bool allowcolors_local;
  bool showgrid_local;
  int sizemode_local;
  int maxlen_local;
  char *textbuffer_local;
  DMenu *parent_local;
  DTextEnterMenu *this_local;
  
  DMenu::DMenu(&this->super_DMenu,parent);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00b63818;
  this->mEnterString = textbuffer;
  this->mEnterSize = maxlen;
  sVar1 = strlen(textbuffer);
  this->mEnterPos = (uint)sVar1;
  this->mSizeMode = sizemode;
  local_3d = true;
  if (!showgrid) {
    local_3d = FBoolCVar::operator_cast_to_bool(&m_showinputgrid);
  }
  this->mInputGridOkay = local_3d;
  if (this->mEnterPos == 0) {
    this->InputGridX = 0;
    this->InputGridY = 0;
  }
  else {
    this->InputGridX = 0xc;
    this->InputGridY = 4;
  }
  this->AllowColors = allowcolors;
  return;
}

Assistant:

DTextEnterMenu::DTextEnterMenu(DMenu *parent, char *textbuffer, int maxlen, int sizemode, bool showgrid, bool allowcolors)
: DMenu(parent)
{
	mEnterString = textbuffer;
	mEnterSize = maxlen;
	mEnterPos = (unsigned)strlen(textbuffer);
	mSizeMode = sizemode;
	mInputGridOkay = showgrid || m_showinputgrid;
	if (mEnterPos > 0)
	{
		InputGridX = INPUTGRID_WIDTH - 1;
		InputGridY = INPUTGRID_HEIGHT - 1;
	}
	else
	{
		// If we are naming a new save, don't start the cursor on "end".
		InputGridX = 0;
		InputGridY = 0;
	}
	AllowColors = allowcolors; // [TP]
}